

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayInstance::createTexture
          (TextureGather2DArrayInstance *this)

{
  MaybeTextureSwizzle *swizzle;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *this_00;
  TextureFormat TVar2;
  TextureFormat TVar3;
  Texture2DArray *pTVar4;
  TextureGather2DArrayInstance *pTVar5;
  int iVar6;
  deUint32 seed;
  Texture2DArray *pTVar7;
  long *plVar8;
  undefined8 *puVar9;
  TextureBinding *this_01;
  Context *pCVar10;
  ulong *puVar11;
  long *plVar12;
  size_type *psVar13;
  MessageBuilder *__n;
  void *__buf;
  SharedPtrStateBase *extraout_RDX;
  long lVar14;
  PixelBufferAccess *dst;
  long in_RSI;
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  TextureBindingSp TVar19;
  string local_3d8;
  long local_3b8;
  string local_3b0;
  long *local_390;
  long local_388;
  long local_380;
  long lStack_378;
  TextureFormat local_370;
  MovePtr<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> texture;
  ulong *local_358;
  long local_350;
  ulong local_348 [2];
  long local_338;
  string local_330;
  TextureGather2DArrayInstance *local_310;
  long local_308;
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  Sampler local_2bc;
  LogImage local_280;
  undefined1 local_1f0 [120];
  ios_base local_178 [264];
  TextureFormatInfo texFmtInfo;
  
  TVar2 = *(TextureFormat *)(**(long **)(in_RSI + 8) + 0x10);
  local_310 = this;
  tcu::getTextureFormatInfo(&texFmtInfo,(TextureFormat *)(in_RSI + 0x218));
  pTVar7 = (Texture2DArray *)operator_new(0x58);
  tcu::Texture2DArray::Texture2DArray
            (pTVar7,(TextureFormat *)(in_RSI + 0x218),*(int *)(in_RSI + 0x264),
             *(int *)(in_RSI + 0x268),*(int *)(in_RSI + 0x26c));
  local_2bc._0_8_ = *(undefined8 *)(in_RSI + 0x224);
  local_2bc._12_8_ = *(undefined8 *)(in_RSI + 0x240);
  local_2bc.compare = *(CompareMode *)(in_RSI + 0x220);
  local_2bc.wrapR = REPEAT_GL;
  local_2bc.lodThreshold = 0.0;
  local_2bc.normalizedCoords = true;
  local_2bc.depthStencilMode = MODE_DEPTH;
  local_2bc._32_8_ = 0;
  local_2bc.borderColor.v._4_5_ = 0;
  local_2bc.borderColor.v.uData[2]._1_3_ = 0;
  local_2bc._48_5_ = 0;
  lVar14 = (long)*(int *)(in_RSI + 0x248);
  iVar6 = (int)((long)(pTVar7->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar7->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
  local_3b8 = in_RSI;
  texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data.ptr
       = pTVar7;
  if (*(int *)(in_RSI + 0x248) < iVar6) {
    paVar1 = &local_3b0.field_2;
    local_308 = (long)iVar6;
    local_370 = TVar2;
    do {
      tcu::Texture2DArray::allocLevel
                (texture.
                 super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
                 m_data.ptr,(int)lVar14);
      lVar17 = local_3b8;
      dst = ((texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->super_TextureLevelPyramid).m_access.
            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar14;
      local_338 = lVar14;
      seed = tcu::CommandLine::getBaseSeed(*(CommandLine **)(**(long **)(local_3b8 + 8) + 0x18));
      fillWithRandomColorTiles(dst,&texFmtInfo.valueMin,&texFmtInfo.valueMax,seed);
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"InputTextureLevel","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::ostream::operator<<((MessageBuilder *)local_1f0,(int)local_338);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,0xb26425);
      puVar11 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_3b0.field_2._M_allocated_capacity = *puVar11;
        local_3b0.field_2._8_8_ = plVar8[3];
        local_3b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3b0.field_2._M_allocated_capacity = *puVar11;
        local_3b0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_3b0._M_string_length = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::LogImageSet::LogImageSet((LogImageSet *)&local_280,&local_3d8,&local_3b0);
      tcu::TestLog::startImageSet
                ((TestLog *)local_370,local_280.m_name._M_dataplus._M_p,
                 local_280.m_description._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
        operator_delete(local_280.m_description._M_dataplus._M_p,
                        local_280.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
        operator_delete(local_280.m_name._M_dataplus._M_p,
                        local_280.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if (local_390 != &local_380) {
        operator_delete(local_390,local_380 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      if (0 < *(int *)(lVar17 + 0x26c)) {
        iVar6 = 0;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
          std::ostream::operator<<((MessageBuilder *)local_1f0,iVar6);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
          std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
          plVar8 = (long *)std::__cxx11::string::replace((ulong)local_2e0,0,(char *)0x0,0xb26413);
          local_390 = &local_380;
          plVar12 = plVar8 + 2;
          if ((long *)*plVar8 == plVar12) {
            local_380 = *plVar12;
            lStack_378 = plVar8[3];
          }
          else {
            local_380 = *plVar12;
            local_390 = (long *)*plVar8;
          }
          local_388 = plVar8[1];
          *plVar8 = (long)plVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_390);
          puVar11 = (ulong *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_3b0.field_2._M_allocated_capacity = *puVar11;
            local_3b0.field_2._8_8_ = plVar8[3];
            local_3b0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_3b0.field_2._M_allocated_capacity = *puVar11;
            local_3b0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_3b0._M_string_length = plVar8[1];
          *plVar8 = (long)puVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
          std::ostream::operator<<((MessageBuilder *)local_1f0,iVar6);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
          std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar1) {
            uVar15 = local_3b0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_350 + local_3b0._M_string_length) {
            uVar16 = 0xf;
            if (local_358 != local_348) {
              uVar16 = local_348[0];
            }
            if (uVar16 < local_350 + local_3b0._M_string_length) goto LAB_0063d462;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_358,0,(char *)0x0,(ulong)local_3b0._M_dataplus._M_p);
          }
          else {
LAB_0063d462:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_3b0,(ulong)local_358);
          }
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          psVar13 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_3d8.field_2._M_allocated_capacity = *psVar13;
            local_3d8.field_2._8_8_ = puVar9[3];
          }
          else {
            local_3d8.field_2._M_allocated_capacity = *psVar13;
            local_3d8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_3d8._M_string_length = puVar9[1];
          *puVar9 = psVar13;
          puVar9[1] = 0;
          *(undefined1 *)psVar13 = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
          std::ostream::operator<<((MessageBuilder *)local_1f0,iVar6);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
          std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
          plVar8 = (long *)std::__cxx11::string::replace((ulong)local_300,0,(char *)0x0,0xb26491);
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          psVar13 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_330.field_2._M_allocated_capacity = *psVar13;
            local_330.field_2._8_8_ = plVar8[3];
          }
          else {
            local_330.field_2._M_allocated_capacity = *psVar13;
            local_330._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_330._M_string_length = plVar8[1];
          *plVar8 = (long)psVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          tcu::getSubregion((PixelBufferAccess *)local_1f0,dst,0,0,iVar6,
                            (dst->super_ConstPixelBufferAccess).m_size.m_data[0],
                            (dst->super_ConstPixelBufferAccess).m_size.m_data[1],1);
          __n = (MessageBuilder *)local_1f0;
          tcu::LogImage::LogImage
                    (&local_280,&local_3d8,&local_330,(ConstPixelBufferAccess *)local_1f0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_280,local_370.order,__buf,(size_t)__n);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
            operator_delete(local_280.m_description._M_dataplus._M_p,
                            local_280.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
            operator_delete(local_280.m_name._M_dataplus._M_p,
                            local_280.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          if (local_300[0] != local_2f0) {
            operator_delete(local_300[0],local_2f0[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
          }
          if (local_358 != local_348) {
            operator_delete(local_358,local_348[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
          }
          if (local_390 != &local_380) {
            operator_delete(local_390,local_380 + 1);
          }
          if (local_2e0[0] != local_2d0) {
            operator_delete(local_2e0[0],local_2d0[0] + 1);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < *(int *)(local_3b8 + 0x26c));
      }
      TVar2 = local_370;
      tcu::TestLog::endImageSet((TestLog *)local_370);
      TVar3 = local_370;
      this_00 = (ostringstream *)(local_1f0 + 8);
      local_370.order = TVar2.order;
      local_370.type = TVar2.type;
      local_1f0._0_4_ = local_370.order;
      local_1f0._4_4_ = local_370.type;
      local_370 = TVar3;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Note: texture level\'s size is ",0x1e);
      local_280.m_name._M_dataplus._M_p =
           *(pointer *)(dst->super_ConstPixelBufferAccess).m_size.m_data;
      local_280.m_name._M_string_length._0_4_ = (dst->super_ConstPixelBufferAccess).m_size.m_data[2]
      ;
      tcu::operator<<((ostream *)this_00,(Vector<int,_3> *)&local_280);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_178);
      lVar14 = local_338 + 1;
    } while (lVar14 != local_308);
  }
  pTVar4 = texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
           m_data.ptr;
  tcu::Texture2DArray::Texture2DArray
            ((Texture2DArray *)local_1f0,
             (TextureFormat *)
             texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>
             .m_data.ptr,
             (texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->m_width,
             (texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->m_height,
             (texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data
             .ptr)->m_numLayers);
  pTVar7 = (Texture2DArray *)(local_3b8 + 0x288);
  tcu::Texture2DArray::operator=(pTVar7,(Texture2DArray *)local_1f0);
  tcu::Texture3D::~Texture3D((Texture3D *)local_1f0);
  if (0 < (int)((ulong)((long)(pTVar4->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar4->super_TextureLevelPyramid).m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    swizzle = (MaybeTextureSwizzle *)(local_3b8 + 0x22c);
    lVar18 = 8;
    lVar14 = 0;
    lVar17 = 0;
    do {
      if (*(long *)((long)&((pTVar4->super_TextureLevelPyramid).m_data.
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar18) != 0) {
        tcu::Texture2DArray::allocLevel(pTVar7,(int)lVar17);
        swizzlePixels((PixelBufferAccess *)(*(long *)(local_3b8 + 0x2a8) + lVar14),
                      (ConstPixelBufferAccess *)
                      ((long)(((pTVar4->super_TextureLevelPyramid).m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess).m_size.m_data + lVar14 + -8),swizzle);
      }
      lVar17 = lVar17 + 1;
      lVar14 = lVar14 + 0x28;
      lVar18 = lVar18 + 0x10;
    } while (lVar17 < (int)((ulong)((long)(pTVar4->super_TextureLevelPyramid).m_access.
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pTVar4->super_TextureLevelPyramid).m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x33333333);
  }
  this_01 = (TextureBinding *)operator_new(0x68);
  pTVar7 = texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.
           m_data.ptr;
  texture.super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>.m_data.ptr
       = (Texture2DArray *)0x0;
  TextureBinding::TextureBinding(this_01,pTVar7,&local_2bc);
  pTVar5 = local_310;
  (local_310->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)0x0;
  (local_310->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  m_context = (Context *)0x0;
  (local_310->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)this_01;
  pCVar10 = (Context *)operator_new(0x20);
  *(undefined4 *)&pCVar10->m_platformInterface = 0;
  *(undefined4 *)((long)&pCVar10->m_platformInterface + 4) = 0;
  pCVar10->m_testCtx = (TestContext *)&PTR__SharedPtrState_00d25678;
  pCVar10->m_progCollection = (ProgramCollection<vk::ProgramBinary> *)this_01;
  (pTVar5->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.m_context
       = pCVar10;
  *(undefined4 *)&pCVar10->m_platformInterface = 1;
  *(undefined4 *)((long)&pCVar10->m_platformInterface + 4) = 1;
  de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::reset
            (&texture.
              super_UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>);
  TVar19.m_state = extraout_RDX;
  TVar19.m_ptr = (TextureBinding *)pTVar5;
  return TVar19;
}

Assistant:

TextureBindingSp TextureGather2DArrayInstance::createTexture (void)
{
	TestLog&						log			= m_context.getTestContext().getLog();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_baseParams.textureFormat);
	MovePtr<tcu::Texture2DArray>	texture		= MovePtr<tcu::Texture2DArray>(new tcu::Texture2DArray(m_baseParams.textureFormat, m_textureSize.x(), m_textureSize.y(), m_textureSize.z()));
	const tcu::Sampler				sampler		(m_baseParams.wrapS, m_baseParams.wrapT, tcu::Sampler::REPEAT_GL,
												 m_baseParams.minFilter, m_baseParams.magFilter,
												 0.0f /* LOD threshold */, true /* normalized coords */, m_baseParams.shadowCompareMode);

	{
		const int	levelBegin	= m_baseParams.baseLevel;
		const int	levelEnd	= texture->getNumLevels();
		DE_ASSERT(m_baseParams.baseLevel < texture->getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			texture->allocLevel(levelNdx);
			const PixelBufferAccess& level = texture->getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());

			log << TestLog::ImageSet("InputTextureLevel", "Input texture, level " + de::toString(levelNdx));
			for (int layerNdx = 0; layerNdx < m_textureSize.z(); layerNdx++)
				log << TestLog::Image("InputTextureLevel" + de::toString(layerNdx) + "Layer" + de::toString(layerNdx),
									  "Layer " + de::toString(layerNdx),
									  tcu::getSubregion(level, 0, 0, layerNdx, level.getWidth(), level.getHeight(), 1));
			log << TestLog::EndImageSet
				<< TestLog::Message << "Note: texture level's size is " << IVec3(level.getWidth(), level.getHeight(), level.getDepth()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, *texture, m_baseParams.textureSwizzle);
	}

	return TextureBindingSp(new TextureBinding(texture.release(), sampler));
}